

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

void __thiscall
clickhouse::SocketHolder::SetTcpKeepAlive(SocketHolder *this,int idle,int intvl,int cnt)

{
  int val;
  undefined4 local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  local_30 = 1;
  local_2c = cnt;
  local_28 = intvl;
  local_24 = idle;
  setsockopt(this->handle_,1,9,&local_30,4);
  setsockopt(this->handle_,6,4,&local_24,4);
  setsockopt(this->handle_,6,5,&local_28,4);
  setsockopt(this->handle_,6,6,&local_2c,4);
  return;
}

Assistant:

void SocketHolder::SetTcpKeepAlive(int idle, int intvl, int cnt) noexcept {
    int val = 1;
    
#if defined(_unix_)
    setsockopt(handle_, SOL_SOCKET, SO_KEEPALIVE, &val, sizeof(val));
#   if defined(_linux_)
        setsockopt(handle_, IPPROTO_TCP, TCP_KEEPIDLE, &idle, sizeof(idle));
#   elif defined(_darwin_)
        setsockopt(handle_, IPPROTO_TCP, TCP_KEEPALIVE, &idle, sizeof(idle));
#   else
#       error "platform does not supported"
#   endif
    setsockopt(handle_, IPPROTO_TCP, TCP_KEEPINTVL, &intvl, sizeof(intvl));
    setsockopt(handle_, IPPROTO_TCP, TCP_KEEPCNT, &cnt, sizeof(cnt));
#else
    setsockopt(handle_, SOL_SOCKET, SO_KEEPALIVE, (const char*)&val, sizeof(val));
    std::ignore = idle = intvl = cnt;
#endif
}